

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddRPathCheckRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmMakefile *this_00;
  cmComputeLinkInformation *this_01;
  ostream *poVar3;
  Indent IVar4;
  WrapQuotes wrapQuotes;
  string_view str;
  string newRpath;
  string local_78;
  string *local_58;
  string local_50;
  
  wrapQuotes = (WrapQuotes)toDestDirPath;
  if ((this->ImportLibrary == false) &&
     (bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config), bVar1)) {
    local_58 = toDestDirPath;
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
    bVar1 = cmMakefile::IsOn(this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar1) &&
       (this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config),
       this_01 != (cmComputeLinkInformation *)0x0)) {
      IVar4.Level = indent.Level;
      if (indent.Level < 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"file(RPATH_CHECK\n",0x11);
      }
      else {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar4.Level = IVar4.Level + -1;
        } while (IVar4.Level != 0);
        std::__ostream_insert<char,std::char_traits<char>>(os,"file(RPATH_CHECK\n",0x11);
        IVar4.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar4.Level = IVar4.Level + -1;
          } while (IVar4.Level != 0);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"     FILE \"",0xb);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(local_58->_M_dataplus)._M_p,local_58->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
      PVar2 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0095);
      if (PVar2 < NEW) {
        cmComputeLinkInformation::GetChrpathString_abi_cxx11_(&local_78,this_01);
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"     RPATH \"",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\")\n",3);
      }
      else {
        cmComputeLinkInformation::GetChrpathString_abi_cxx11_(&local_50,this_01);
        str._M_str = (char *)0x0;
        str._M_len = (size_t)local_50._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_78,(cmOutputConverter *)local_50._M_string_length,str,wrapQuotes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"     RPATH ",0xb);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRPathCheckRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }
  // Skip if on Apple
  if (this->Target->Target->GetMakefile()->IsOn(
        "CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  // Write a rule to remove the installed file if its rpath is not the
  // new rpath.  This is needed for existing build/install trees when
  // the installed rpath changes but the file is not rebuilt.
  os << indent << "file(RPATH_CHECK\n"
     << indent << "     FILE \"" << toDestDirPath << "\"\n";

  // CMP0095: ``RPATH`` entries are properly escaped in the intermediary
  // CMake install script.
  switch (this->Target->GetPolicyStatusCMP0095()) {
    case cmPolicies::WARN:
      // No author warning needed here, we warn later in
      // cmInstallTargetGenerator::AddChrpathPatchRule().
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      // Get the install RPATH from the link information.
      std::string newRpath = cli->GetChrpathString();
      os << indent << "     RPATH \"" << newRpath << "\")\n";
      break;
    }
    default: {
      // Get the install RPATH from the link information and
      // escape any CMake syntax in the install RPATH.
      std::string escapedNewRpath =
        cmOutputConverter::EscapeForCMake(cli->GetChrpathString());
      os << indent << "     RPATH " << escapedNewRpath << ")\n";
      break;
    }
  }
}